

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  reference other;
  Token local_70;
  
  if ((this->tokens_).size_ == 0) {
    WastLexer::GetToken(&local_70,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_70);
    Token::~Token(&local_70);
  }
  other = CircularArray<wabt::Token,_2UL>::front(&this->tokens_);
  Token::Token(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken(this));
  }
  return tokens_.front();
}